

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O3

void __thiscall ExpressionFunctionHandler::updateArchitecture(ExpressionFunctionHandler *this)

{
  pointer pIVar1;
  Architecture *pAVar2;
  Identifier *name;
  pointer __k;
  pair<std::_Rb_tree_iterator<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>,_std::_Rb_tree_iterator<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>_>
  pVar3;
  
  __k = (this->architectureFunctions).super__Vector_base<Identifier,_std::allocator<Identifier>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (this->architectureFunctions).super__Vector_base<Identifier,_std::allocator<Identifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pIVar1) {
    do {
      pVar3 = std::
              _Rb_tree<Identifier,_std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>,_std::_Select1st<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>_>
              ::equal_range((_Rb_tree<Identifier,_std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>,_std::_Select1st<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>_>
                             *)this,__k);
      std::
      _Rb_tree<Identifier,_std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>,_std::_Select1st<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>_>
      ::_M_erase_aux((_Rb_tree<Identifier,_std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>,_std::_Select1st<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>_>
                      *)this,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
      __k = __k + 1;
    } while (__k != pIVar1);
    __k = (this->architectureFunctions).super__Vector_base<Identifier,_std::allocator<Identifier>_>.
          _M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<Identifier,_std::allocator<Identifier>_>::_M_erase_at_end
            (&this->architectureFunctions,__k);
  this->registeringArchitecture = true;
  pAVar2 = Architecture::current();
  (*pAVar2->_vptr_Architecture[2])(pAVar2,this);
  this->registeringArchitecture = false;
  return;
}

Assistant:

void ExpressionFunctionHandler::updateArchitecture()
{
	// remove functions of previous architecture
	for (const auto &name : architectureFunctions)
	{
		entries.erase(name);
	}

	architectureFunctions.clear();

	// Add functions of current architecture. Remember functions that were added
	registeringArchitecture = true;
	Architecture::current().registerExpressionFunctions(*this);
	registeringArchitecture = false;
}